

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccelf.c
# Opt level: O1

int tcc_output_file(TCCState *s,char *filename)

{
  byte bVar1;
  Section *pSVar2;
  unsigned_long uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  Section *pSVar8;
  sym_attr *psVar9;
  Section *pSVar10;
  size_t sVar11;
  size_t sVar12;
  undefined4 *ptr;
  FILE *__s;
  Section **ppSVar13;
  undefined8 *__src;
  void *pvVar14;
  undefined8 *puVar15;
  uchar *puVar16;
  undefined8 uVar17;
  ulong uVar18;
  byte *pbVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  undefined4 *puVar23;
  long *plVar24;
  int iVar25;
  uchar *puVar26;
  ulong uVar27;
  long lVar28;
  uchar *puVar29;
  ulong uVar30;
  ulong uVar31;
  char *pcVar32;
  uint uVar33;
  uint uVar34;
  uint *puVar35;
  uint *puVar36;
  Elf64_Addr EVar37;
  long lVar38;
  bool bVar39;
  dyn_inf local_158;
  undefined8 local_128;
  long lStack_120;
  Elf64_Addr local_118;
  unsigned_long uStack_110;
  unsigned_long local_108;
  undefined8 uStack_100;
  long local_f8;
  long lStack_f0;
  long local_e0;
  undefined8 uStack_d8;
  Elf64_Ehdr ehdr;
  int local_80;
  undefined4 *local_78;
  Section *local_58;
  Section *local_50;
  ulong local_48;
  
  local_158.data_offset = 0;
  local_158.rel_addr = 0;
  local_158.dynamic = (Section *)0x0;
  local_158.dynstr = (Section *)0x0;
  local_158.rel_size = 0;
  uVar34 = s->output_type;
  s->nb_errors = 0;
  if (uVar34 == 4) {
    pSVar8 = (Section *)0x0;
    local_58 = (Section *)0x0;
    local_50 = (Section *)0x0;
  }
  else {
    tcc_add_runtime(s);
    resolve_common_syms(s);
    if (s->static_link == 0) {
      if (uVar34 == 2) {
        pcVar7 = getenv("LD_SO");
        pcVar32 = "/lib64/ld-linux-x86-64.so.2";
        if (pcVar7 != (char *)0x0) {
          pcVar32 = pcVar7;
        }
        pSVar8 = new_section(s,".interp",1,2);
        pSVar8->sh_addralign = 1;
        sVar12 = strlen(pcVar32);
        sVar11 = section_add(pSVar8,sVar12 + 1,1);
        strcpy((char *)(pSVar8->data + sVar11),pcVar32);
      }
      else {
        pSVar8 = (Section *)0x0;
      }
      pSVar10 = new_symtab(s,".dynsym",0xb,2,".dynstr",".hash",2);
      s->dynsym = pSVar10;
      local_50 = pSVar10->link;
      local_58 = new_section(s,".dynamic",6,3);
      local_58->link = local_50;
      local_58->sh_entsize = 0x10;
      build_got(s);
      if (uVar34 == 2) {
        if (0x18 < (long)symtab_section->data_offset) {
          puVar29 = symtab_section->data + 0x18;
          puVar26 = symtab_section->data;
          do {
            puVar16 = puVar29;
            if (*(ushort *)(puVar26 + 0x1e) == 0) {
              puVar29 = symtab_section->link->data + *(uint *)(puVar26 + 0x18);
              pSVar10 = s->dynsymtab_section;
              iVar20 = find_elf_sym(pSVar10,(char *)puVar29);
              if (iVar20 == 0) {
                if (((puVar26[0x1c] & 0xf0) != 0x20) &&
                   (iVar20 = strcmp((char *)puVar29,"_fp_hw"), iVar20 != 0)) {
                  tcc_error_noabort("undefined symbol \'%s\'",puVar29);
                }
              }
              else {
                puVar26 = pSVar10->data;
                bVar1 = puVar26[(long)iVar20 * 0x18 + 4];
                if ((bVar1 & 7) == 2) {
                  iVar20 = put_elf_sym(s->dynsym,0,
                                       *(unsigned_long *)(puVar26 + (long)iVar20 * 0x18 + 0x10),0x12
                                       ,0,0,(char *)puVar29);
                  psVar9 = get_sym_attr(s,(int)((ulong)((long)puVar16 - (long)symtab_section->data)
                                               >> 3) * -0x55555555,1);
                  psVar9->dyn_index = iVar20;
                }
                else if ((bVar1 & 0xf) == 1) {
                  uVar31 = bss_section->data_offset + 0xf & 0xfffffffffffffff0;
                  set_elf_sym(s->symtab,uVar31,
                              *(unsigned_long *)(puVar26 + (long)iVar20 * 0x18 + 0x10),(uint)bVar1,0
                              ,bss_section->sh_num,(char *)puVar29);
                  iVar4 = put_elf_sym(s->dynsym,uVar31,
                                      *(unsigned_long *)(puVar26 + (long)iVar20 * 0x18 + 0x10),
                                      (uint)puVar26[(long)iVar20 * 0x18 + 4],0,bss_section->sh_num,
                                      (char *)puVar29);
                  if ((puVar26[(long)iVar20 * 0x18 + 4] & 0xf0) == 0x20) {
                    pSVar10 = s->dynsymtab_section;
                    if (0x18 < (long)pSVar10->data_offset) {
                      puVar36 = (uint *)(pSVar10->data + 0x18);
                      do {
                        if ((*(long *)(puVar36 + 2) == *(long *)(puVar26 + (long)iVar20 * 0x18 + 8))
                           && (((byte)puVar36[1] & 0xfffffff0) == 0x10)) {
                          put_elf_sym(s->dynsym,uVar31,*(unsigned_long *)(puVar36 + 4),
                                      (uint)(byte)puVar36[1],0,bss_section->sh_num,
                                      (char *)(pSVar10->link->data + *puVar36));
                          break;
                        }
                        puVar36 = puVar36 + 6;
                      } while (puVar36 < pSVar10->data + pSVar10->data_offset);
                    }
                  }
                  put_elf_reloca(s->dynsym,bss_section,uVar31,5,iVar4,0);
                  bss_section->data_offset =
                       uVar31 + *(long *)(puVar26 + (long)iVar20 * 0x18 + 0x10);
                }
              }
            }
            else if ((s->rdynamic != 0) && (0xf < puVar26[0x1c])) {
              set_elf_sym(s->dynsym,*(Elf64_Addr *)(puVar26 + 0x20),
                          *(unsigned_long *)(puVar26 + 0x28),(uint)puVar26[0x1c],0,
                          (uint)*(ushort *)(puVar26 + 0x1e),
                          (char *)(symtab_section->link->data + *(uint *)(puVar26 + 0x18)));
            }
            puVar29 = puVar16 + 0x18;
            puVar26 = puVar16;
          } while (puVar16 + 0x18 < symtab_section->data + symtab_section->data_offset);
        }
        if (s->nb_errors != 0) {
          iVar20 = -1;
          local_78 = (undefined4 *)0x0;
          ptr = (undefined4 *)0x0;
          goto LAB_001122c2;
        }
        pSVar10 = s->dynsymtab_section;
        if (0x18 < (long)pSVar10->data_offset) {
          puVar36 = (uint *)(pSVar10->data + 0x18);
          do {
            pSVar2 = symtab_section;
            puVar29 = pSVar10->link->data + *puVar36;
            iVar20 = find_elf_sym(symtab_section,(char *)puVar29);
            if (iVar20 == 0) {
LAB_00110ff0:
              if ((*(short *)((long)puVar36 + 6) == 0) && ((puVar36[1] & 0xf0) != 0x20)) {
                tcc_warning("undefined dynamic symbol \'%s\'",puVar29);
              }
            }
            else {
              puVar26 = pSVar2->data;
              if ((*(ushort *)(puVar26 + (long)iVar20 * 0x18 + 6) == 0) ||
                 (puVar26[(long)iVar20 * 0x18 + 4] < 0x10)) goto LAB_00110ff0;
              set_elf_sym(s->dynsym,*(Elf64_Addr *)(puVar26 + (long)iVar20 * 0x18 + 8),
                          *(unsigned_long *)(puVar26 + (long)iVar20 * 0x18 + 0x10),
                          (uint)puVar26[(long)iVar20 * 0x18 + 4],0,
                          (uint)*(ushort *)(puVar26 + (long)iVar20 * 0x18 + 6),(char *)puVar29);
            }
            puVar36 = puVar36 + 6;
            pSVar10 = s->dynsymtab_section;
          } while (puVar36 < pSVar10->data + pSVar10->data_offset);
        }
      }
      else if (0x18 < (long)symtab_section->data_offset) {
        puVar35 = (uint *)(symtab_section->data + 0x18);
        puVar36 = puVar35;
        do {
          if (0xf < (byte)puVar35[1]) {
            iVar20 = put_elf_sym(s->dynsym,*(Elf64_Addr *)(puVar35 + 2),
                                 *(unsigned_long *)(puVar35 + 4),(uint)(byte)puVar35[1],0,
                                 (uint)*(ushort *)((long)puVar35 + 6),
                                 (char *)(symtab_section->link->data + *puVar35));
            psVar9 = get_sym_attr(s,(int)((ulong)((long)puVar36 - (long)symtab_section->data) >> 3)
                                    * -0x55555555,1);
            psVar9->dyn_index = iVar20;
          }
          puVar35 = puVar35 + 6;
          puVar36 = puVar36 + 6;
        } while (puVar35 < symtab_section->data + symtab_section->data_offset);
      }
    }
    else {
      pSVar8 = (Section *)0x0;
      local_58 = (Section *)0x0;
      local_50 = (Section *)0x0;
    }
    build_got_entries(s);
  }
  pSVar10 = new_section(s,".shstrtab",3,0);
  uVar31 = 1;
  sVar11 = section_add(pSVar10,1,1);
  pSVar10->data[sVar11] = '\0';
  bVar39 = true;
  if (1 < s->nb_sections) {
    bVar39 = false;
    do {
      pSVar2 = s->sections[uVar31];
      if ((((uVar34 == 3) && (pSVar2->sh_type == 4)) && ((pSVar2->sh_flags & 2U) == 0)) &&
         ((s->sections[pSVar2->sh_info]->sh_flags & 2) != 0)) {
        if ((long)pSVar2->data_offset < 1) {
          iVar20 = 0;
        }
        else {
          puVar29 = pSVar2->data;
          puVar26 = puVar29 + pSVar2->data_offset;
          iVar20 = 0;
          do {
            lVar38 = *(long *)(puVar29 + 8);
            iVar4 = (int)lVar38;
            if (iVar4 - 10U < 2) {
LAB_00111117:
              iVar20 = iVar20 + 1;
            }
            else if (iVar4 == 2) {
              lVar28 = lVar38 >> 0x20;
              if (s->nb_sym_attrs <= (int)((ulong)lVar38 >> 0x20)) {
                lVar28 = 0;
              }
              iVar20 = (iVar20 + 1) - (uint)(s->sym_attrs[lVar28].dyn_index == 0);
            }
            else if (iVar4 == 1) goto LAB_00111117;
            puVar29 = puVar29 + 0x18;
          } while (puVar29 < puVar26);
        }
        if (iVar20 == 0) goto LAB_00111191;
        pSVar2->sh_flags = pSVar2->sh_flags | 2;
        pSVar2->sh_size = (long)iVar20 * 0x18;
        if ((s->sections[pSVar2->sh_info]->sh_flags & 4) != 0) {
          bVar39 = true;
        }
      }
      else {
LAB_00111191:
        if (((uVar34 == 4) || (s->do_debug != 0)) ||
           (((pSVar2->sh_flags & 2) != 0 || (uVar31 == s->nb_sections - 1)))) {
          pSVar2->sh_size = pSVar2->data_offset;
        }
      }
      if ((pSVar2->sh_size != 0) || ((pSVar2->sh_flags & 2) != 0)) {
        sVar12 = strlen(pSVar2->name);
        uVar3 = pSVar10->data_offset;
        EVar37 = (long)((sVar12 << 0x20) + 0x100000000) >> 0x20;
        sVar11 = section_add(pSVar10,EVar37,1);
        memmove(pSVar10->data + sVar11,pSVar2->name,EVar37);
        pSVar2->sh_name = (int)uVar3;
      }
      uVar31 = uVar31 + 1;
    } while ((long)uVar31 < (long)s->nb_sections);
    bVar39 = !bVar39;
  }
  pSVar10->sh_size = pSVar10->data_offset;
  if (local_58 != (Section *)0x0) {
    if (0 < s->nb_loaded_dlls) {
      lVar38 = 0;
      do {
        if (s->loaded_dlls[lVar38]->level == 0) {
          pcVar32 = s->loaded_dlls[lVar38]->name;
          sVar12 = strlen(pcVar32);
          uVar3 = local_50->data_offset;
          EVar37 = (long)((sVar12 << 0x20) + 0x100000000) >> 0x20;
          sVar11 = section_add(local_50,EVar37,1);
          memmove(local_50->data + sVar11,pcVar32,EVar37);
          sVar11 = section_add(local_58,0x10,1);
          puVar26 = local_58->data;
          puVar29 = puVar26 + sVar11;
          puVar29[0] = '\x01';
          puVar29[1] = '\0';
          puVar29[2] = '\0';
          puVar29[3] = '\0';
          puVar29[4] = '\0';
          puVar29[5] = '\0';
          puVar29[6] = '\0';
          puVar29[7] = '\0';
          *(long *)(puVar26 + sVar11 + 8) = (long)(int)uVar3;
        }
        lVar38 = lVar38 + 1;
      } while (lVar38 < s->nb_loaded_dlls);
    }
    pcVar32 = s->rpath;
    if (pcVar32 != (char *)0x0) {
      uVar17 = 0x1d;
      if (s->enable_new_dtags == 0) {
        uVar17 = 0xf;
      }
      sVar12 = strlen(pcVar32);
      uVar3 = local_50->data_offset;
      EVar37 = (long)((sVar12 << 0x20) + 0x100000000) >> 0x20;
      sVar11 = section_add(local_50,EVar37,1);
      memmove(local_50->data + sVar11,pcVar32,EVar37);
      sVar11 = section_add(local_58,0x10,1);
      puVar29 = local_58->data;
      *(undefined8 *)(puVar29 + sVar11) = uVar17;
      *(long *)(puVar29 + sVar11 + 8) = (long)(int)uVar3;
    }
    if (uVar34 == 3) {
      pcVar32 = s->soname;
      if (pcVar32 != (char *)0x0) {
        sVar12 = strlen(pcVar32);
        uVar3 = local_50->data_offset;
        EVar37 = (long)((sVar12 << 0x20) + 0x100000000) >> 0x20;
        sVar11 = section_add(local_50,EVar37,1);
        memmove(local_50->data + sVar11,pcVar32,EVar37);
        sVar11 = section_add(local_58,0x10,1);
        puVar26 = local_58->data;
        puVar29 = puVar26 + sVar11;
        puVar29[0] = '\x0e';
        puVar29[1] = '\0';
        puVar29[2] = '\0';
        puVar29[3] = '\0';
        puVar29[4] = '\0';
        puVar29[5] = '\0';
        puVar29[6] = '\0';
        puVar29[7] = '\0';
        *(long *)(puVar26 + sVar11 + 8) = (long)(int)uVar3;
      }
      if (!bVar39) {
        sVar11 = section_add(local_58,0x10,1);
        puVar26 = local_58->data;
        puVar29 = puVar26 + sVar11;
        puVar29[0] = '\x16';
        puVar29[1] = '\0';
        puVar29[2] = '\0';
        puVar29[3] = '\0';
        puVar29[4] = '\0';
        puVar29[5] = '\0';
        puVar29[6] = '\0';
        puVar29[7] = '\0';
        puVar26 = puVar26 + sVar11 + 8;
        puVar26[0] = '\0';
        puVar26[1] = '\0';
        puVar26[2] = '\0';
        puVar26[3] = '\0';
        puVar26[4] = '\0';
        puVar26[5] = '\0';
        puVar26[6] = '\0';
        puVar26[7] = '\0';
      }
    }
    if (s->symbolic != 0) {
      sVar11 = section_add(local_58,0x10,1);
      puVar26 = local_58->data;
      puVar29 = puVar26 + sVar11;
      puVar29[0] = '\x10';
      puVar29[1] = '\0';
      puVar29[2] = '\0';
      puVar29[3] = '\0';
      puVar29[4] = '\0';
      puVar29[5] = '\0';
      puVar29[6] = '\0';
      puVar29[7] = '\0';
      puVar26 = puVar26 + sVar11 + 8;
      puVar26[0] = '\0';
      puVar26[1] = '\0';
      puVar26[2] = '\0';
      puVar26[3] = '\0';
      puVar26[4] = '\0';
      puVar26[5] = '\0';
      puVar26[6] = '\0';
      puVar26[7] = '\0';
    }
    local_158.dynamic = local_58;
    local_158.dynstr = local_50;
    local_158.data_offset = local_58->data_offset;
    fill_dynamic(s,&local_158);
    local_58->sh_size = local_58->data_offset;
    local_50->sh_size = local_50->data_offset;
  }
  uVar5 = 0;
  if (uVar34 != 4) {
    if (uVar34 == 3) {
      uVar5 = 3;
    }
    else {
      uVar5 = (uint)(s->static_link == 0) * 3 + 2;
    }
  }
  uVar31 = (ulong)(uVar5 * 0x38);
  local_78 = (undefined4 *)tcc_mallocz(uVar31);
  local_e0 = (long)s->nb_sections;
  ptr = (undefined4 *)tcc_malloc(local_e0 * 4);
  *ptr = 0;
  uVar21 = uVar5 * 0x38 + 0x40;
  uVar33 = 0;
  if (s->output_format == 0) {
    uVar33 = uVar21;
  }
  uVar30 = 0x200000;
  if (s->section_align != 0) {
    uVar30 = (ulong)s->section_align;
  }
  if (uVar5 == 0) {
    iVar20 = 1;
  }
  else {
    local_80 = (int)uVar30;
    if (s->has_text_addr == 0) {
      uVar18 = (ulong)(local_80 - 1U & uVar33 | (uint)(s->output_type != 3) << 0x16);
    }
    else {
      uVar18 = s->text_addr;
      uVar22 = (uint)uVar18 & local_80 - 1U;
      uVar6 = local_80 - 1U & uVar33;
      iVar20 = 0;
      if ((int)uVar22 < (int)uVar6) {
        iVar20 = local_80;
      }
      uVar33 = (uVar33 - uVar6) + uVar22 + iVar20;
    }
    lVar38 = 0x70;
    if (pSVar8 == (Section *)0x0) {
      lVar38 = 0;
    }
    puVar23 = (undefined4 *)(lVar38 + (long)local_78);
    local_80 = local_80 + -1;
    iVar20 = 1;
    local_48 = 0;
    local_158.rel_size = 0;
    iVar4 = 0;
    do {
      *puVar23 = 1;
      puVar23[1] = 6 - (uint)(iVar4 == 0);
      *(ulong *)(puVar23 + 0xc) = uVar30;
      iVar25 = 0;
      do {
        if (1 < s->nb_sections) {
          lVar38 = 1;
          do {
            pSVar10 = s->sections[lVar38];
            uVar6 = pSVar10->sh_flags & 3;
            if (iVar4 == 0) {
              if (uVar6 == 2) goto LAB_00111670;
            }
            else if (uVar6 == 3) {
LAB_00111670:
              if (pSVar10 == pSVar8) {
                if (iVar25 == 0) goto LAB_0011169c;
              }
              else {
                switch(pSVar10->sh_type) {
                case 3:
                case 5:
                case 0xb:
                  if (iVar25 == 1) {
LAB_0011169c:
                    ptr[iVar20] = (int)lVar38;
                    uVar27 = (long)-pSVar10->sh_addralign &
                             (uVar18 + (long)pSVar10->sh_addralign) - 1;
                    uVar33 = uVar33 + ((int)uVar27 - (int)uVar18);
                    pSVar10->sh_offset = (long)(int)uVar33;
                    pSVar10->sh_addr = uVar27;
                    if (*(long *)(puVar23 + 2) == 0) {
                      *(long *)(puVar23 + 2) = (long)(int)uVar33;
                      *(ulong *)(puVar23 + 4) = uVar27;
                      *(ulong *)(puVar23 + 6) = uVar27;
                    }
                    if (pSVar10->sh_type == 4) {
                      if (local_158.rel_size == 0) {
                        local_48 = uVar27;
                      }
                      local_158.rel_size = local_158.rel_size + pSVar10->sh_size;
                    }
                    iVar20 = iVar20 + 1;
                    uVar18 = uVar27 + pSVar10->sh_size;
                    if (pSVar10->sh_type != 8) {
                      uVar33 = uVar33 + (int)pSVar10->sh_size;
                    }
                  }
                  break;
                case 4:
                  if (iVar25 == 2) goto LAB_0011169c;
                  break;
                default:
                  if (iVar25 == 3) goto LAB_0011169c;
                  break;
                case 8:
                  if (iVar25 == 4) goto LAB_0011169c;
                }
              }
            }
            lVar38 = lVar38 + 1;
          } while (lVar38 < s->nb_sections);
        }
        iVar25 = iVar25 + 1;
      } while (iVar25 != 5);
      if (iVar4 == 0) {
        uVar27 = -*(long *)(puVar23 + 0xc);
        *(ulong *)(puVar23 + 2) = *(ulong *)(puVar23 + 2) & uVar27;
        *(ulong *)(puVar23 + 4) = *(ulong *)(puVar23 + 4) & uVar27;
        *(ulong *)(puVar23 + 6) = *(ulong *)(puVar23 + 6) & uVar27;
      }
      *(long *)(puVar23 + 8) = (long)(int)uVar33 - *(long *)(puVar23 + 2);
      *(ulong *)(puVar23 + 10) = uVar18 - *(long *)(puVar23 + 4);
      if (iVar4 == 0) {
        if (s->output_format == 0) {
          uVar27 = uVar18 & uVar30 - 1;
          if (uVar27 != 0) {
            uVar27 = uVar30;
          }
          uVar18 = uVar18 + uVar27;
        }
        else {
          uVar18 = uVar18 + (uVar30 - 1) & -uVar30;
          uVar33 = uVar33 + local_80 & (uint)-uVar30;
        }
      }
      puVar23 = puVar23 + 0xe;
      bVar39 = iVar4 == 0;
      iVar4 = iVar4 + 1;
    } while (bVar39);
    local_158.rel_addr = local_48;
  }
  if (1 < s->nb_sections) {
    lVar38 = 1;
    do {
      pSVar10 = s->sections[lVar38];
      if ((uVar5 == 0) || ((pSVar10->sh_flags & 2) == 0)) {
        lVar28 = (long)iVar20;
        iVar20 = iVar20 + 1;
        ptr[lVar28] = (int)lVar38;
        uVar33 = -pSVar10->sh_addralign & (uVar33 + pSVar10->sh_addralign) - 1;
        pSVar10->sh_offset = (long)(int)uVar33;
        if (pSVar10->sh_type != 8) {
          uVar33 = uVar33 + (int)pSVar10->sh_size;
        }
      }
      lVar38 = lVar38 + 1;
    } while (lVar38 < s->nb_sections);
  }
  ehdr._56_8_ = uVar31;
  if (uVar34 != 4) {
    if (pSVar8 != (Section *)0x0) {
      *local_78 = 6;
      *(undefined8 *)(local_78 + 2) = 0x40;
      *(ulong *)(local_78 + 10) = uVar31;
      *(ulong *)(local_78 + 8) = uVar31;
      lVar38 = pSVar8->sh_addr - uVar31;
      *(long *)(local_78 + 4) = lVar38;
      *(long *)(local_78 + 6) = lVar38;
      local_78[1] = 5;
      *(undefined8 *)(local_78 + 0xc) = 4;
      local_78[0xe] = 3;
      *(unsigned_long *)(local_78 + 0x10) = pSVar8->sh_offset;
      EVar37 = pSVar8->sh_addr;
      *(Elf64_Addr *)(local_78 + 0x12) = EVar37;
      *(Elf64_Addr *)(local_78 + 0x14) = EVar37;
      *(unsigned_long *)(local_78 + 0x16) = pSVar8->sh_size;
      *(unsigned_long *)(local_78 + 0x18) = pSVar8->sh_size;
      local_78[0xf] = 4;
      *(long *)(local_78 + 0x1a) = (long)pSVar8->sh_addralign;
    }
    if (local_58 != (Section *)0x0) {
      uVar31 = (ulong)uVar5;
      local_78[uVar31 * 0xe + -0xe] = 2;
      *(unsigned_long *)(local_78 + uVar31 * 0xe + -0xc) = local_58->sh_offset;
      EVar37 = local_58->sh_addr;
      *(Elf64_Addr *)(local_78 + uVar31 * 0xe + -10) = EVar37;
      *(Elf64_Addr *)(local_78 + uVar31 * 0xe + -8) = EVar37;
      *(unsigned_long *)(local_78 + uVar31 * 0xe + -6) = local_58->sh_size;
      *(unsigned_long *)(local_78 + uVar31 * 0xe + -4) = local_58->sh_size;
      local_78[uVar31 * 0xe + -0xd] = 6;
      *(long *)(local_78 + uVar31 * 0xe + -2) = (long)local_58->sh_addralign;
      local_58->data_offset = local_158.data_offset;
      fill_dynamic(s,&local_158);
      *(int *)s->got->data = (int)local_58->sh_addr;
      if ((uVar34 & 0xfffffffe) == 2) {
        relocate_plt(s);
      }
      if (0x18 < (long)s->dynsym->data_offset) {
        puVar29 = s->dynsym->data + 0x18;
        do {
          if ((ushort)(*(ushort *)(puVar29 + 6) - 1) < 0xfeff) {
            *(Elf64_Addr *)(puVar29 + 8) =
                 *(long *)(puVar29 + 8) + s->sections[*(ushort *)(puVar29 + 6)]->sh_addr;
          }
          puVar29 = puVar29 + 0x18;
        } while (puVar29 < s->dynsym->data + s->dynsym->data_offset);
      }
    }
    relocate_syms(s,s->symtab,0);
    iVar4 = s->nb_errors;
    iVar20 = -1;
    if (iVar4 == 0) {
      if (1 < s->nb_sections) {
        lVar38 = 1;
        do {
          pSVar8 = s->sections[lVar38];
          if ((pSVar8->reloc != (Section *)0x0) && (pSVar8 != s->got)) {
            relocate_section(s,pSVar8);
          }
          lVar38 = lVar38 + 1;
        } while (lVar38 < s->nb_sections);
      }
      iVar20 = 0;
      if (1 < s->nb_sections) {
        lVar38 = 1;
        do {
          pSVar8 = s->sections[lVar38];
          if ((((pSVar8->sh_flags & 2) != 0) && (pSVar8->sh_type == 4)) &&
             (0 < (long)pSVar8->data_offset)) {
            plVar24 = (long *)pSVar8->data;
            pSVar10 = s->sections[pSVar8->sh_info];
            do {
              *plVar24 = *plVar24 + pSVar10->sh_addr;
              plVar24 = plVar24 + 3;
            } while (plVar24 < pSVar8->data + pSVar8->data_offset);
          }
          lVar38 = lVar38 + 1;
          iVar20 = 0;
        } while (lVar38 < s->nb_sections);
      }
    }
    if (iVar4 != 0) goto LAB_001122c2;
    ppSVar13 = (Section **)tcc_malloc((long)s->nb_sections << 3);
    pvVar14 = tcc_malloc((long)s->nb_sections << 2);
    iVar20 = s->nb_sections;
    if (iVar20 < 1) {
      uVar6 = 0;
    }
    else {
      lVar38 = 0;
      uVar6 = 0;
      do {
        lVar28 = (long)(int)ptr[lVar38];
        pSVar8 = s->sections[lVar28];
        if ((lVar38 == 0) || (pSVar8->sh_name != 0)) {
          *(uint *)((long)pvVar14 + lVar28 * 4) = uVar6;
          ppSVar13[(int)uVar6] = pSVar8;
          uVar6 = uVar6 + 1;
        }
        else {
          *(undefined4 *)((long)pvVar14 + lVar28 * 4) = 0;
          lVar28 = (long)iVar20;
          iVar20 = iVar20 + -1;
          ppSVar13[lVar28 + -1] = pSVar8;
        }
        lVar38 = lVar38 + 1;
      } while (lVar38 < s->nb_sections);
    }
    if (0 < (int)uVar6) {
      uVar31 = 0;
      do {
        pSVar8 = ppSVar13[uVar31];
        if ((pSVar8 != (Section *)0x0) && (pSVar8->sh_num = (int)uVar31, pSVar8->sh_type == 4)) {
          pSVar8->sh_info = *(int *)((long)pvVar14 + (long)pSVar8->sh_info * 4);
        }
        uVar31 = uVar31 + 1;
      } while (uVar6 != uVar31);
    }
    pSVar8 = symtab_section;
    if (0x18 < (long)symtab_section->data_offset) {
      puVar29 = symtab_section->data + 0x18;
      do {
        if ((ushort)(*(ushort *)(puVar29 + 6) - 1) < 0xfeff) {
          *(undefined2 *)(puVar29 + 6) =
               *(undefined2 *)((long)pvVar14 + (ulong)*(ushort *)(puVar29 + 6) * 4);
        }
        puVar29 = puVar29 + 0x18;
      } while (puVar29 < pSVar8->data + pSVar8->data_offset);
    }
    if ((s->static_link == 0) && (0x18 < (long)s->dynsym->data_offset)) {
      puVar29 = s->dynsym->data + 0x18;
      do {
        if ((ushort)(*(ushort *)(puVar29 + 6) - 1) < 0xfeff) {
          *(undefined2 *)(puVar29 + 6) =
               *(undefined2 *)((long)pvVar14 + (ulong)*(ushort *)(puVar29 + 6) * 4);
        }
        puVar29 = puVar29 + 0x18;
      } while (puVar29 < s->dynsym->data + s->dynsym->data_offset);
    }
    if (0 < s->nb_sections) {
      lVar38 = 0;
      do {
        ptr[lVar38] = (int)lVar38;
        lVar38 = lVar38 + 1;
      } while (lVar38 < s->nb_sections);
    }
    tcc_free(s->sections);
    s->sections = ppSVar13;
    s->nb_sections = uVar6;
    tcc_free(pvVar14);
    if ((uVar34 == 2) && (s->static_link != 0)) {
      fill_got(s);
    }
    else {
      pSVar8 = s->got;
      if ((pSVar8 != (Section *)0x0) && (0 < (long)pSVar8->reloc->data_offset)) {
        plVar24 = (long *)pSVar8->reloc->data;
        do {
          lVar38 = plVar24[1];
          if ((int)lVar38 == 8) {
            puVar29 = symtab_section->data;
            lVar28 = 0;
            if ((int)((ulong)lVar38 >> 0x20) < s->nb_sym_attrs) {
              lVar28 = lVar38 >> 0x20;
            }
            if (*plVar24 - pSVar8->sh_addr != (ulong)s->sym_attrs[lVar28].got_offset) {
              tcc_error_noabort("huh");
            }
            plVar24[1] = 8;
            plVar24[2] = *(long *)(puVar29 + (lVar38 >> 0x20) * 0x18 + 8);
          }
          plVar24 = plVar24 + 3;
          pSVar8 = s->got;
        } while (plVar24 < pSVar8->reloc->data + pSVar8->reloc->data_offset);
      }
    }
  }
  uVar34 = 0x1ff;
  if (s->output_type == 4) {
    uVar34 = 0x1b6;
  }
  unlink(filename);
  iVar20 = open(filename,0x241,(ulong)uVar34);
  if (iVar20 < 0) {
    tcc_error_noabort("could not write \'%s\'",filename);
    iVar20 = -1;
  }
  else {
    __s = fdopen(iVar20,"wb");
    if (s->verbose != 0) {
      printf("<- %s\n");
    }
    if (s->output_format == 0) {
      iVar20 = s->nb_sections;
      ehdr.e_shoff = 0;
      ehdr.e_flags = 0;
      ehdr.e_ehsize = 0;
      ehdr.e_phentsize = 0;
      ehdr.e_entry = 0;
      ehdr.e_phoff = 0;
      ehdr.e_type = 0;
      ehdr.e_machine = 0;
      ehdr.e_version = 0;
      ehdr.e_ident[0] = '\0';
      ehdr.e_ident[1] = '\0';
      ehdr.e_ident[2] = '\0';
      ehdr.e_ident[3] = '\0';
      ehdr.e_ident[4] = '\0';
      ehdr.e_ident[5] = '\0';
      ehdr.e_ident[6] = '\0';
      ehdr.e_ident[7] = '\0';
      if (uVar5 != 0) {
        ehdr.e_shoff = 0x38000000000000;
        ehdr._50_6_ = 0;
        ehdr.e_flags._0_2_ = (ushort)uVar5;
        ehdr.e_entry = 0x40;
      }
      uStack_d8 = 0x10102464c457f;
      if (s->output_type == 3) {
        ehdr.e_ident[8] = '\x03';
        ehdr.e_ident[9] = '\0';
        ehdr.e_ident[10] = '\0';
        ehdr.e_ident[0xb] = '\0';
        ehdr.e_ident[0xc] = '\0';
        ehdr.e_ident[0xd] = '\0';
        ehdr.e_ident[0xe] = '\0';
        ehdr.e_ident[0xf] = '\0';
        ehdr._16_8_ = text_section->sh_addr;
LAB_00111f02:
      }
      else {
        if (s->output_type != 4) {
          ehdr.e_ident[8] = '\x02';
          ehdr.e_ident[9] = '\0';
          ehdr.e_ident[10] = '\0';
          ehdr.e_ident[0xb] = '\0';
          ehdr.e_ident[0xc] = '\0';
          ehdr.e_ident[0xd] = '\0';
          ehdr.e_ident[0xe] = '\0';
          ehdr.e_ident[0xf] = '\0';
          ehdr._16_8_ = get_elf_sym_addr(s,"_start",1);
          goto LAB_00111f02;
        }
        ehdr.e_ident[8] = '\x01';
        ehdr.e_ident[9] = '\0';
      }
      ehdr.e_ident[10] = '>';
      ehdr.e_ident[0xb] = '\0';
      ehdr.e_ident[0xc] = '\x01';
      ehdr.e_ident[0xd] = '\0';
      ehdr.e_ident[0xe] = '\0';
      ehdr.e_ident[0xf] = '\0';
      ehdr.e_phoff = (Elf64_Off)(int)(uVar33 + 3 & 0xfffffffc);
      ehdr.e_shoff._0_6_ = CONCAT24(0x40,(undefined4)ehdr.e_shoff);
      ehdr.e_flags._2_2_ = 0x40;
      ehdr.e_ehsize = (Elf64_Half)iVar20;
      ehdr.e_phentsize = ehdr.e_ehsize - 1;
      fwrite(&uStack_d8,1,0x40,__s);
      fwrite(local_78,1,ehdr._56_8_,__s);
      pSVar8 = symtab_section;
      uVar34 = (uint)(symtab_section->data_offset / 0x18);
      uVar3 = (long)(int)uVar34 * 0x18;
      __src = (undefined8 *)tcc_malloc(uVar3);
      pvVar14 = tcc_malloc((long)(int)uVar34 * 4);
      puVar15 = __src;
      if (0 < (int)uVar34) {
        pbVar19 = pSVar8->data + 4;
        uVar31 = 0;
        do {
          if (*pbVar19 < 0x10) {
            *(int *)((long)pvVar14 + uVar31 * 4) =
                 (int)((ulong)((long)puVar15 - (long)__src) >> 3) * -0x55555555;
            puVar15[2] = *(undefined8 *)(pbVar19 + 0xc);
            uVar17 = *(undefined8 *)(pbVar19 + 4);
            *puVar15 = *(undefined8 *)(pbVar19 + -4);
            puVar15[1] = uVar17;
            puVar15 = puVar15 + 3;
          }
          uVar31 = uVar31 + 1;
          pbVar19 = pbVar19 + 0x18;
        } while ((uVar34 & 0x7fffffff) != uVar31);
      }
      if (pSVar8->sh_size != 0) {
        pSVar8->sh_info = (int)((ulong)((long)puVar15 - (long)__src) >> 3) * -0x55555555;
      }
      if (0 < (int)uVar34) {
        pbVar19 = pSVar8->data + 4;
        uVar31 = 0;
        do {
          if (0xf < *pbVar19) {
            *(int *)((long)pvVar14 + uVar31 * 4) =
                 (int)((ulong)((long)puVar15 - (long)__src) >> 3) * -0x55555555;
            puVar15[2] = *(undefined8 *)(pbVar19 + 0xc);
            uVar17 = *(undefined8 *)(pbVar19 + 4);
            *puVar15 = *(undefined8 *)(pbVar19 + -4);
            puVar15[1] = uVar17;
            puVar15 = puVar15 + 3;
          }
          uVar31 = uVar31 + 1;
          pbVar19 = pbVar19 + 0x18;
        } while ((uVar34 & 0x7fffffff) != uVar31);
      }
      memcpy(pSVar8->data,__src,uVar3);
      tcc_free(__src);
      if (1 < s->nb_sections) {
        lVar38 = 1;
        do {
          pSVar10 = s->sections[lVar38];
          if (((pSVar10->sh_type == 4) && (pSVar10->link == pSVar8)) &&
             (0 < (long)pSVar10->data_offset)) {
            puVar29 = pSVar10->data;
            do {
              *(ulong *)(puVar29 + 8) =
                   (long)(int)*(long *)(puVar29 + 8) +
                   ((ulong)*(uint *)((long)pvVar14 + (*(long *)(puVar29 + 8) >> 0x20) * 4) << 0x20);
              puVar29 = puVar29 + 0x18;
            } while (puVar29 < pSVar10->data + pSVar10->data_offset);
          }
          lVar38 = lVar38 + 1;
        } while (lVar38 < s->nb_sections);
      }
      tcc_free(pvVar14);
      if (1 < s->nb_sections) {
        lVar38 = 1;
        do {
          pSVar8 = s->sections[(int)ptr[lVar38]];
          if (pSVar8->sh_type != 8) {
            uVar31 = (ulong)(int)uVar21;
            if (uVar31 < pSVar8->sh_offset) {
              do {
                fputc(0,__s);
                uVar31 = uVar31 + 1;
              } while (uVar31 < pSVar8->sh_offset);
              uVar21 = (uint)uVar31;
            }
            iVar20 = (int)pSVar8->sh_size;
            if (iVar20 != 0) {
              fwrite(pSVar8->data,1,(long)iVar20,__s);
            }
            uVar21 = uVar21 + iVar20;
          }
          lVar38 = lVar38 + 1;
        } while (lVar38 < s->nb_sections);
      }
      lVar38 = ehdr.e_phoff - (long)(int)uVar21;
      if ((ulong)(long)(int)uVar21 <= ehdr.e_phoff && lVar38 != 0) {
        do {
          fputc(0,__s);
          lVar38 = lVar38 + -1;
        } while (lVar38 != 0);
      }
      if (0 < s->nb_sections) {
        lVar38 = 0;
        do {
          local_f8 = 0;
          lStack_f0 = 0;
          local_108 = 0;
          uStack_100 = 0;
          local_118 = 0;
          uStack_110 = 0;
          local_128 = 0;
          lStack_120 = 0;
          pSVar8 = s->sections[lVar38];
          if (pSVar8 != (Section *)0x0) {
            local_128 = CONCAT44(pSVar8->sh_type,pSVar8->sh_name);
            lStack_120 = (long)pSVar8->sh_flags;
            lStack_f0 = (long)pSVar8->sh_entsize;
            uStack_100._0_4_ = 0;
            if (pSVar8->link != (Section *)0x0) {
              uStack_100._0_4_ = pSVar8->link->sh_num;
            }
            uStack_100 = CONCAT44(pSVar8->sh_info,(int)uStack_100);
            local_f8 = (long)pSVar8->sh_addralign;
            local_118 = pSVar8->sh_addr;
            uStack_110 = pSVar8->sh_offset;
            local_108 = pSVar8->sh_size;
          }
          fwrite(&local_128,1,0x40,__s);
          lVar38 = lVar38 + 1;
        } while (lVar38 < s->nb_sections);
      }
    }
    else if (1 < s->nb_sections) {
      iVar20 = 0;
      lVar38 = 1;
      do {
        pSVar8 = s->sections[(int)ptr[lVar38]];
        if ((pSVar8->sh_type != 8) && ((pSVar8->sh_flags & 2) != 0)) {
          uVar31 = (ulong)iVar20;
          if (uVar31 < pSVar8->sh_offset) {
            do {
              fputc(0,__s);
              uVar31 = uVar31 + 1;
            } while (uVar31 < pSVar8->sh_offset);
            iVar20 = (int)uVar31;
          }
          iVar4 = (int)pSVar8->sh_size;
          fwrite(pSVar8->data,1,(long)iVar4,__s);
          iVar20 = iVar4 + iVar20;
        }
        lVar38 = lVar38 + 1;
      } while (lVar38 < s->nb_sections);
    }
    fclose(__s);
    iVar20 = 0;
  }
  s->nb_sections = (int)local_e0;
LAB_001122c2:
  tcc_free(ptr);
  tcc_free(local_78);
  return iVar20;
}

Assistant:

LIBTCCAPI int tcc_output_file(TCCState* s, const char* filename) {
  int ret;
#ifdef TCC_TARGET_PE
  if (s->output_type != TCC_OUTPUT_OBJ) {
    ret = pe_output_file(s, filename);
  } else
#endif
    ret = elf_output_file(s, filename);
  return ret;
}